

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::TreeEnsembleParameters_TreeNode::InternalSwap
          (TreeEnsembleParameters_TreeNode *this,TreeEnsembleParameters_TreeNode *other)

{
  TreeEnsembleParameters_TreeNode *other_local;
  TreeEnsembleParameters_TreeNode *this_local;
  
  google::protobuf::internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->evaluationinfo_).super_RepeatedPtrFieldBase,
             &(other->evaluationinfo_).super_RepeatedPtrFieldBase);
  std::swap<unsigned_long>(&this->treeid_,&other->treeid_);
  std::swap<unsigned_long>(&this->nodeid_,&other->nodeid_);
  std::swap<int>(&this->nodebehavior_,&other->nodebehavior_);
  std::swap<bool>(&this->missingvaluetrackstruechild_,&other->missingvaluetrackstruechild_);
  std::swap<unsigned_long>(&this->branchfeatureindex_,&other->branchfeatureindex_);
  std::swap<double>(&this->branchfeaturevalue_,&other->branchfeaturevalue_);
  std::swap<unsigned_long>(&this->truechildnodeid_,&other->truechildnodeid_);
  std::swap<unsigned_long>(&this->falsechildnodeid_,&other->falsechildnodeid_);
  std::swap<double>(&this->relativehitrate_,&other->relativehitrate_);
  std::swap<int>(&this->_cached_size_,&other->_cached_size_);
  return;
}

Assistant:

void TreeEnsembleParameters_TreeNode::InternalSwap(TreeEnsembleParameters_TreeNode* other) {
  evaluationinfo_.InternalSwap(&other->evaluationinfo_);
  std::swap(treeid_, other->treeid_);
  std::swap(nodeid_, other->nodeid_);
  std::swap(nodebehavior_, other->nodebehavior_);
  std::swap(missingvaluetrackstruechild_, other->missingvaluetrackstruechild_);
  std::swap(branchfeatureindex_, other->branchfeatureindex_);
  std::swap(branchfeaturevalue_, other->branchfeaturevalue_);
  std::swap(truechildnodeid_, other->truechildnodeid_);
  std::swap(falsechildnodeid_, other->falsechildnodeid_);
  std::swap(relativehitrate_, other->relativehitrate_);
  std::swap(_cached_size_, other->_cached_size_);
}